

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool is_identifier(char *s,qsizetype len)

{
  bool bVar1;
  
  if (0 < len) {
    bVar1 = std::all_of<char_const*,bool(*)(char)>(s,s + len,is_ident_char);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool is_identifier(const char *s, qsizetype len)
{
    if (len < 1)
        return false;
    return std::all_of(s, s + len, is_ident_char);
}